

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
spvtools::anon_unknown_0::OrderBlocks
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          ControlFlowGraph *cfg,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *id_to_index)

{
  SingleBlock *pSVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  size_type sVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  reference puVar6;
  SingleBlock *pSVar7;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar8;
  value_type_conflict local_134;
  reference local_130;
  SingleBlock *block_1;
  size_t index;
  undefined1 local_118 [19];
  undefined1 local_105;
  uint32_t local_104;
  iterator iStack_100;
  uint32_t case_block_id;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  SingleBlock *block;
  _Base_ptr local_d8;
  undefined1 local_d0;
  byte local_c5;
  uint32_t local_c4;
  undefined1 local_c0 [3];
  bool post_visit;
  uint32_t block_index;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> visited;
  undefined1 local_88 [8];
  stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
  dfs_stack;
  vector<unsigned_int,_std::allocator<unsigned_int>_> post_order;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *id_to_index_local;
  ControlFlowGraph *cfg_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *order;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &dfs_stack.c.
              super__Deque_base<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  pvVar3 = std::
           vector<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
           ::operator[](&cfg->blocks,0);
  pvVar3->nest_level = 0;
  pvVar3 = std::
           vector<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
           ::operator[](&cfg->blocks,0);
  pvVar3->nest_level_assigned = true;
  std::
  stack<spvtools::(anonymous_namespace)::StackEntry,std::deque<spvtools::(anonymous_namespace)::StackEntry,std::allocator<spvtools::(anonymous_namespace)::StackEntry>>>
  ::
  stack<std::deque<spvtools::(anonymous_namespace)::StackEntry,std::allocator<spvtools::(anonymous_namespace)::StackEntry>>,void>
            ((stack<spvtools::(anonymous_namespace)::StackEntry,std::deque<spvtools::(anonymous_namespace)::StackEntry,std::allocator<spvtools::(anonymous_namespace)::StackEntry>>>
              *)local_88);
  visited._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  visited._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ = 0;
  std::
  stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
  ::push((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
          *)local_88,(value_type *)&visited._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_c0);
  while (bVar2 = std::
                 stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                 ::empty((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                          *)local_88), ((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar4 = std::
             stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
             ::top((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                    *)local_88);
    local_c4 = pvVar4->block_index;
    pvVar4 = std::
             stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
             ::top((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                    *)local_88);
    local_c5 = pvVar4->post_visit & 1;
    std::
    stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
    ::pop((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
           *)local_88);
    if ((local_c5 & 1) == 0) {
      sVar5 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)local_c0,&local_c4);
      if (sVar5 == 0) {
        pVar8 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       local_c0,&local_c4);
        local_d8 = (_Base_ptr)pVar8.first._M_node;
        local_d0 = pVar8.second;
        block._0_4_ = local_c4;
        block._4_1_ = 1;
        std::
        stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
        ::push((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                *)local_88,(value_type *)&block);
        pvVar3 = std::
                 vector<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                 ::operator[](&cfg->blocks,(ulong)local_c4);
        NestSuccessors(cfg,pvVar3,id_to_index);
        pvVar3->reachable = true;
        VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                       *)local_88,id_to_index,(pvVar3->successors).true_block_id);
        VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                       *)local_88,id_to_index,(pvVar3->successors).false_block_id);
        VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                       *)local_88,id_to_index,(pvVar3->successors).body_block_id);
        VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                       *)local_88,id_to_index,(pvVar3->successors).next_block_id);
        this = &(pvVar3->successors).case_block_ids;
        __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this);
        iStack_100 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this);
        while (bVar2 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff00), bVar2) {
          puVar6 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&__end3);
          local_104 = *puVar6;
          VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                         *)local_88,id_to_index,local_104);
          __gnu_cxx::
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++(&__end3);
        }
        VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                       *)local_88,id_to_index,(pvVar3->successors).continue_block_id);
        VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                       *)local_88,id_to_index,(pvVar3->successors).merge_block_id);
      }
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &dfs_stack.c.
                  super__Deque_base<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node,&local_c4);
    }
  }
  local_105 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::rbegin
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_118 + 8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::rend
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&index + 7));
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
             (reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)(local_118 + 8),
             (reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_118,(allocator_type *)((long)&index + 7));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&index + 7));
  for (block_1 = (SingleBlock *)0x0; pSVar1 = block_1,
      pSVar7 = (SingleBlock *)
               std::
               vector<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
               ::size(&cfg->blocks), pSVar1 < pSVar7;
      block_1 = (SingleBlock *)((long)&block_1->byte_offset + 1)) {
    local_130 = std::
                vector<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                ::operator[](&cfg->blocks,(size_type)block_1);
    if ((local_130->reachable & 1U) == 0) {
      local_134 = (value_type_conflict)block_1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&local_134);
      local_130->nest_level = 0;
      local_130->nest_level_assigned = true;
    }
  }
  local_105 = 1;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_c0);
  std::
  stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
  ::~stack((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
            *)local_88);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &dfs_stack.c.
              super__Deque_base<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> OrderBlocks(
    ControlFlowGraph& cfg,
    const std::unordered_map<uint32_t, uint32_t>& id_to_index) {
  std::vector<uint32_t> post_order;

  // Nest level of a function's first block is 0.
  cfg.blocks[0].nest_level = 0;
  cfg.blocks[0].nest_level_assigned = true;

  // Stack of block indices as they are visited.
  std::stack<StackEntry> dfs_stack;
  dfs_stack.push({0, false});

  std::set<uint32_t> visited;

  while (!dfs_stack.empty()) {
    const uint32_t block_index = dfs_stack.top().block_index;
    const bool post_visit = dfs_stack.top().post_visit;
    dfs_stack.pop();

    // If this is the second time the block is visited, that's the post-order
    // visit.
    if (post_visit) {
      post_order.push_back(block_index);
      continue;
    }

    // If already visited, another path got to it first (like a case
    // fallthrough), avoid reprocessing it.
    if (visited.count(block_index) > 0) {
      continue;
    }
    visited.insert(block_index);

    // Push it back in the stack for post-order visit
    dfs_stack.push({block_index, true});

    SingleBlock& block = cfg.blocks[block_index];

    // Assign nest levels of successors right away.  The successors are either
    // nested under this block, or are back or forward edges to blocks outside
    // this nesting level (no farther than the merge block), whose nesting
    // levels are already assigned before this block is visited.
    NestSuccessors(cfg, block, id_to_index);
    block.reachable = true;

    // The post-order visit yields the order in which the blocks are naturally
    // ordered _backwards_. So blocks to be ordered last should be visited
    // first.  In other words, they should be pushed to the DFS stack last.
    VisitSuccesor(&dfs_stack, id_to_index, block.successors.true_block_id);
    VisitSuccesor(&dfs_stack, id_to_index, block.successors.false_block_id);
    VisitSuccesor(&dfs_stack, id_to_index, block.successors.body_block_id);
    VisitSuccesor(&dfs_stack, id_to_index, block.successors.next_block_id);
    for (uint32_t case_block_id : block.successors.case_block_ids) {
      VisitSuccesor(&dfs_stack, id_to_index, case_block_id);
    }
    VisitSuccesor(&dfs_stack, id_to_index, block.successors.continue_block_id);
    VisitSuccesor(&dfs_stack, id_to_index, block.successors.merge_block_id);
  }

  std::vector<uint32_t> order(post_order.rbegin(), post_order.rend());

  // Finally, dump all unreachable blocks at the end
  for (size_t index = 0; index < cfg.blocks.size(); ++index) {
    SingleBlock& block = cfg.blocks[index];

    if (!block.reachable) {
      order.push_back(static_cast<uint32_t>(index));
      block.nest_level = 0;
      block.nest_level_assigned = true;
    }
  }

  return order;
}